

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp.c
# Opt level: O2

c_int osqp_update_scaled_termination(OSQPWorkspace *work,c_int scaled_termination_new)

{
  c_int cVar1;
  
  if (work == (OSQPWorkspace *)0x0) {
    cVar1 = _osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR,"osqp_update_scaled_termination");
    return cVar1;
  }
  if (1 < (ulong)scaled_termination_new) {
    printf("ERROR in %s: ","osqp_update_scaled_termination");
    printf("scaled_termination should be either 0 or 1");
    putchar(10);
    return 1;
  }
  work->settings->scaled_termination = scaled_termination_new;
  return 0;
}

Assistant:

c_int osqp_update_scaled_termination(OSQPWorkspace *work, c_int scaled_termination_new) {

  // Check if workspace has been initialized
  if (!work) return osqp_error(OSQP_WORKSPACE_NOT_INIT_ERROR);

  // Check that scaled_termination is either 0 or 1
  if ((scaled_termination_new != 0) && (scaled_termination_new != 1)) {
#ifdef PRINTING
    c_eprint("scaled_termination should be either 0 or 1");
#endif /* ifdef PRINTING */
    return 1;
  }

  // Update scaled_termination
  work->settings->scaled_termination = scaled_termination_new;

  return 0;
}